

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O3

void __thiscall
tchecker::
intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>::reset
          (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
           *this,make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *t)

{
  make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *pmVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  underflow_error *this_00;
  code *pcVar3;
  undefined *puVar4;
  
  if ((t != (make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *)0x0) &&
     (p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(t[-1].super_zone_t._ref_clocks.
                        super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1),
     t[-1].super_zone_t._ref_clocks.
     super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi = p_Var2,
     p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xfffffffffffffffe)) {
    this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error((overflow_error *)this_00,"reference counter overflow");
    puVar4 = &std::overflow_error::typeinfo;
    pcVar3 = std::overflow_error::~overflow_error;
LAB_0015d053:
    __cxa_throw(this_00,puVar4,pcVar3);
  }
  pmVar1 = this->_t;
  if (pmVar1 != (make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *)0x0) {
    p_Var2 = pmVar1[-1].super_zone_t._ref_clocks.
             super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
      std::underflow_error::underflow_error(this_00,"reference counter underflow");
      puVar4 = &std::underflow_error::typeinfo;
      pcVar3 = std::underflow_error::~underflow_error;
      goto LAB_0015d053;
    }
    pmVar1[-1].super_zone_t._ref_clocks.
    super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&p_Var2[-1]._M_weak_count + 3);
  }
  this->_t = t;
  return;
}

Assistant:

inline void reset(T * t = nullptr)
  {
    if (t != nullptr)
      t->take_reference();
    if (_t != nullptr)
      _t->release_reference();
    _t = t;
  }